

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

void __thiscall
tinyusdz::PrimMetas::update_from(PrimMetas *this,PrimMetas *rhs,bool override_authored)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  size_type sVar4;
  reference_conflict __x;
  string *psVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
  *item;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  bool override_authored_local;
  PrimMetas *rhs_local;
  PrimMetas *this_local;
  
  bVar1 = nonstd::optional_lite::optional<bool>::has_value(&rhs->active);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<bool>::has_value(&this->active), !bVar1)))) {
    nonstd::optional_lite::optional<bool>::operator=(&this->active,&rhs->active);
  }
  bVar1 = nonstd::optional_lite::optional<bool>::has_value(&rhs->hidden);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<bool>::has_value(&this->hidden), !bVar1)))) {
    nonstd::optional_lite::optional<bool>::operator=(&this->hidden,&rhs->hidden);
  }
  bVar1 = nonstd::optional_lite::optional<tinyusdz::Kind>::has_value(&rhs->kind);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<tinyusdz::Kind>::has_value(&this->kind), !bVar1)))) {
    nonstd::optional_lite::optional<tinyusdz::Kind>::operator=(&this->kind,&rhs->kind);
  }
  bVar1 = nonstd::optional_lite::optional<bool>::has_value(&rhs->instanceable);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<bool>::has_value(&this->instanceable), !bVar1)))) {
    nonstd::optional_lite::optional<bool>::operator=(&this->instanceable,&rhs->instanceable);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->assetInfo);
  if (bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->assetInfo);
    if (bVar1) {
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->assetInfo);
      pvVar3 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->assetInfo);
      OverrideDictionary(pvVar2,pvVar3,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->assetInfo,&rhs->assetInfo);
    }
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->clips);
  if (bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->clips);
    if (bVar1) {
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->clips);
      pvVar3 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->clips);
      OverrideDictionary(pvVar2,pvVar3,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->clips,&rhs->clips);
    }
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->customData);
  if (bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->customData);
    if (bVar1) {
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->customData);
      pvVar3 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->customData);
      OverrideDictionary(pvVar2,pvVar3,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->customData,&rhs->customData);
    }
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->doc);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::has_value(&this->doc),
      !bVar1)))) {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=(&this->doc,&rhs->doc);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->comment);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::has_value
                         (&this->comment), !bVar1)))) {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=
              (&this->comment,&rhs->comment);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->apiSchemas);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::optional<tinyusdz::APISchemas>::has_value(&this->apiSchemas),
      !bVar1)))) {
    nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
              (&this->apiSchemas,&rhs->apiSchemas);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->sdrMetadata);
  if (bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&this->sdrMetadata);
    if (bVar1) {
      pvVar2 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&this->sdrMetadata);
      pvVar3 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
               ::value(&rhs->sdrMetadata);
      OverrideDictionary(pvVar2,pvVar3,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->sdrMetadata,&rhs->sdrMetadata);
    }
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->sceneName);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::has_value(&this->sceneName), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->sceneName,&rhs->sceneName);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->displayName);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::has_value(&this->displayName), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->displayName,&rhs->displayName);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->references);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
               ::has_value(&this->references), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
    ::operator=(&this->references,&rhs->references);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->payload);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
               ::has_value(&this->payload), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
    ::operator=(&this->payload,&rhs->payload);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->inherits);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
               ::has_value(&this->inherits), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
    ::operator=(&this->inherits,&rhs->inherits);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->variantSets);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::has_value(&this->variantSets), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator=(&this->variantSets,&rhs->variantSets);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->variants);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::has_value(&this->variants), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator=(&this->variants,&rhs->variants);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&rhs->specializes);
  if ((bVar1) &&
     ((override_authored ||
      (bVar1 = nonstd::optional_lite::
               optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
               ::has_value(&this->specializes), !bVar1)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
    ::operator=(&this->specializes,&rhs->specializes);
  }
  sVar4 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&rhs->unregisteredMetas);
  if (sVar4 != 0) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&rhs->unregisteredMetas);
    item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&rhs->unregisteredMetas);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&item), bVar1) {
      __x = ::std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator*(&__end2);
      sVar4 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->unregisteredMetas,&__x->first);
      if (sVar4 == 0) {
        psVar5 = (string *)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->unregisteredMetas,(key_type *)__x);
        ::std::__cxx11::string::operator=(psVar5,(string *)&__x->second);
      }
      else if (override_authored) {
        psVar5 = (string *)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->unregisteredMetas,(key_type *)__x);
        ::std::__cxx11::string::operator=(psVar5,(string *)&__x->second);
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  OverrideDictionary(&this->meta,&rhs->meta,override_authored);
  return;
}

Assistant:

void PrimMetas::update_from(const PrimMetas &rhs, const bool override_authored) {
  if (rhs.active.has_value()) {
    if (override_authored || !active.has_value()) {
      active = rhs.active;
    }
  }

  if (rhs.hidden.has_value()) {
    if (override_authored || !hidden.has_value()) {
      hidden = rhs.hidden;
    }
  }

  if (rhs.kind.has_value()) {
    if (override_authored || !kind.has_value()) {
      kind = rhs.kind;
    }
  }

  if (rhs.instanceable.has_value()) {
    if (override_authored || !instanceable.has_value()) {
      instanceable = rhs.instanceable;
    }
  }

  if (rhs.assetInfo) {
    if (assetInfo) {
      OverrideDictionary(assetInfo.value(), rhs.assetInfo.value(), override_authored);
    } else if (override_authored) {
      assetInfo = rhs.assetInfo;
    }
  }

  if (rhs.clips) {
    if (clips) {
      OverrideDictionary(clips.value(), rhs.clips.value(), override_authored);
    } else if (override_authored) {
      clips = rhs.clips;
    }
  }

  if (rhs.customData) {
    if (customData) {
      OverrideDictionary(customData.value(), rhs.customData.value(), override_authored);
    } else if (override_authored) {
      customData = rhs.customData;
    }
  }

  if (rhs.doc) {
    if (override_authored || !doc.has_value()) {
      doc = rhs.doc;
    }
  }

  if (rhs.comment) {
    if (override_authored || !comment.has_value()) {
      comment = rhs.comment;
    }
  }

  if (rhs.apiSchemas) {
    if (override_authored || !apiSchemas.has_value()) {
      apiSchemas = rhs.apiSchemas;
    }
  }

  if (rhs.sdrMetadata) {
    if (sdrMetadata) {
      OverrideDictionary(sdrMetadata.value(), rhs.sdrMetadata.value(), override_authored);
    } else if (override_authored) {
      sdrMetadata = rhs.sdrMetadata;
    }
  }

  if (rhs.sceneName) {
    if (override_authored || !sceneName.has_value()) {
      sceneName = rhs.sceneName;
    }
  }

  if (rhs.displayName) {
    if (override_authored || !displayName.has_value()) {
      displayName = rhs.displayName;
    }
  }

  if (rhs.references) {
    if (override_authored || !references.has_value()) {
      references = rhs.references;
    }
  }
  if (rhs.payload) {
    if (override_authored || !payload.has_value()) {
      payload = rhs.payload;
    }
  }
  if (rhs.inherits) {
    if (override_authored || !inherits.has_value()) {
      inherits = rhs.inherits;
    }
  }
  if (rhs.variantSets) {
    if (override_authored || !variantSets.has_value()) {
      variantSets = rhs.variantSets;
    }
  }
  if (rhs.variants) {
    if (override_authored || !variants.has_value()) {
      variants = rhs.variants;
    }
  }
  if (rhs.specializes) {
    if (override_authored || !specializes.has_value()) {
      specializes = rhs.specializes;
    }
  }

  if (rhs.unregisteredMetas.size()) {
    for (const auto &item : rhs.unregisteredMetas) {
      if (unregisteredMetas.count(item.first)) {
        if (override_authored) {
          unregisteredMetas[item.first] = item.second;
        } 
      } else {
        unregisteredMetas[item.first] = item.second;
      }
    }
  }

  OverrideDictionary(meta, rhs.meta, override_authored);
}